

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chachapoly.c
# Opt level: O2

int chachapoly_pad_aad(mbedtls_chachapoly_context *ctx)

{
  uint uVar1;
  int iVar2;
  uchar zeroes [15];
  
  uVar1 = (uint)ctx->aad_len & 0xf;
  if (uVar1 != 0) {
    zeroes[8] = '\0';
    zeroes[9] = '\0';
    zeroes[10] = '\0';
    zeroes[0xb] = '\0';
    zeroes[0xc] = '\0';
    zeroes[0xd] = '\0';
    zeroes[0xe] = '\0';
    zeroes[0] = '\0';
    zeroes[1] = '\0';
    zeroes[2] = '\0';
    zeroes[3] = '\0';
    zeroes[4] = '\0';
    zeroes[5] = '\0';
    zeroes[6] = '\0';
    zeroes[7] = '\0';
    iVar2 = mbedtls_poly1305_update(&ctx->poly1305_ctx,zeroes,(ulong)(0x10 - uVar1));
    return iVar2;
  }
  return 0;
}

Assistant:

static int chachapoly_pad_aad( mbedtls_chachapoly_context *ctx )
{
    uint32_t partial_block_len = (uint32_t) ( ctx->aad_len % 16U );
    unsigned char zeroes[15];

    if( partial_block_len == 0U )
        return( 0 );

    memset( zeroes, 0, sizeof( zeroes ) );

    return( mbedtls_poly1305_update( &ctx->poly1305_ctx,
                                     zeroes,
                                     16U - partial_block_len ) );
}